

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  bool bVar1;
  allocator<char> local_81;
  string local_80;
  UnitTestFilter local_60;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,filter,&local_81);
  anon_unknown_37::UnitTestFilter::UnitTestFilter(&local_60,&local_80);
  bVar1 = anon_unknown_37::UnitTestFilter::MatchesName(&local_60,name_str);
  anon_unknown_37::UnitTestFilter::~UnitTestFilter(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return bVar1;
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  return UnitTestFilter(filter).MatchesName(name_str);
}